

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O2

void __thiscall TcpServer::TcpServer(TcpServer *this,EventLoop *loop,char *ip,uint16_t port)

{
  undefined8 __p;
  __sighandler_t p_Var1;
  uint16_t port_local;
  char *ip_local;
  EventLoop *loop_local;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  _Any_data __tmp;
  
  (this->ts_acceptor)._M_t.super___uniq_ptr_impl<Acceptor,_std::default_delete<Acceptor>_>._M_t.
  super__Tuple_impl<0UL,_Acceptor_*,_std::default_delete<Acceptor>_>.
  super__Head_base<0UL,_Acceptor_*,_false>._M_head_impl = (Acceptor *)0x0;
  (this->ts_conn_loops).super__Vector_base<EventLoop_*,_std::allocator<EventLoop_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ts_conn_loops).super__Vector_base<EventLoop_*,_std::allocator<EventLoop_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ts_conn_loops).super__Vector_base<EventLoop_*,_std::allocator<EventLoop_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ts_thread_pool)._M_t.super___uniq_ptr_impl<Threadpool,_std::default_delete<Threadpool>_>.
  _M_t.super__Tuple_impl<0UL,_Threadpool_*,_std::default_delete<Threadpool>_>.
  super__Head_base<0UL,_Threadpool_*,_false>._M_head_impl = (Threadpool *)0x0;
  this->ts_thread_num = 1;
  this->ts_next_loop = -1;
  ip_local = ip;
  loop_local = loop;
  Timer::Timer(&this->ts_timer);
  this->ts_tcp_conn_timout_ms = 6000;
  (this->ts_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->ts_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->ts_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->ts_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (this->ts_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  (this->ts_tcp_connections).
  super__Vector_base<std::shared_ptr<TcpConnection>,_std::allocator<std::shared_ptr<TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ts_tcp_connections).
  super__Vector_base<std::shared_ptr<TcpConnection>,_std::allocator<std::shared_ptr<TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ts_tcp_connections).
  super__Vector_base<std::shared_ptr<TcpConnection>,_std::allocator<std::shared_ptr<TcpConnection>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->ts_connected_cb).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->ts_connected_cb).super__Function_base._M_functor + 8) = 0;
  (this->ts_connected_cb).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->ts_connected_cb)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->ts_msg_cb).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->ts_msg_cb).super__Function_base._M_functor + 8) = 0;
  (this->ts_msg_cb).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->ts_msg_cb)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->ts_message_cb).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->ts_message_cb).super__Function_base._M_functor + 8) = 0;
  (this->ts_message_cb).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->ts_message_cb)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->ts_close_cb).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->ts_close_cb).super__Function_base._M_functor + 8) = 0;
  (this->ts_close_cb).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->ts_close_cb)._M_invoker = (_Invoker_type)0x0;
  p_Var1 = signal(1,(__sighandler_t)0x1);
  if ((p_Var1 == (__sighandler_t)0xffffffffffffffff) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] ignore SIGHUP signal error\n","error","TcpServer",0xf);
  }
  p_Var1 = signal(0xd,(__sighandler_t)0x1);
  if ((p_Var1 == (__sighandler_t)0xffffffffffffffff) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] ignore SIGPIPE signal error\n","error","TcpServer",0x12);
  }
  this->ts_acceptor_loop = loop;
  this->ip = ip;
  this->port = port;
  __tmp._8_8_ = 0;
  local_68._M_unused._0_8_ =
       (undefined8)*(undefined8 *)&(this->ts_message_cb).super__Function_base._M_functor;
  local_68._8_8_ = *(undefined8 *)((long)&(this->ts_message_cb).super__Function_base._M_functor + 8)
  ;
  *(TcpServer **)&(this->ts_message_cb).super__Function_base._M_functor = this;
  *(undefined8 *)((long)&(this->ts_message_cb).super__Function_base._M_functor + 8) = 0;
  local_58 = (this->ts_message_cb).super__Function_base._M_manager;
  p_Stack_50 = (this->ts_message_cb)._M_invoker;
  (this->ts_message_cb).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_server.cpp:24:21)>
       ::_M_manager;
  (this->ts_message_cb)._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_server.cpp:24:21)>
       ::_M_invoke;
  __tmp._M_unused._M_object = this;
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  __tmp._M_unused._M_object = this;
  std::make_unique<Acceptor,TcpServer*,EventLoop*&,char_const*&,unsigned_short&>
            ((TcpServer **)&local_68,(EventLoop **)&__tmp,(char **)&loop_local,
             (unsigned_short *)&ip_local);
  __p = local_68._M_unused._0_8_;
  local_68._M_unused._M_object = (void *)0x0;
  std::__uniq_ptr_impl<Acceptor,_std::default_delete<Acceptor>_>::reset
            ((__uniq_ptr_impl<Acceptor,_std::default_delete<Acceptor>_> *)&this->ts_acceptor,
             (pointer)__p);
  std::unique_ptr<Acceptor,_std::default_delete<Acceptor>_>::~unique_ptr
            ((unique_ptr<Acceptor,_std::default_delete<Acceptor>_> *)&local_68);
  return;
}

Assistant:

TcpServer::TcpServer(EventLoop* loop, const char *ip, uint16_t port) {    

    if (signal(SIGHUP, SIG_IGN) == SIG_ERR) {       // SIGHUP: when terminal closing
        PR_ERROR("ignore SIGHUP signal error\n");
    }
    if (signal(SIGPIPE, SIG_IGN) == SIG_ERR) {     // SIGPIPE: write a closed client
        PR_ERROR("ignore SIGPIPE signal error\n");
    }

    ts_acceptor_loop = loop;
    this->ip = ip;
    this->port = port;
    ts_message_cb = [this](const TcpConnSP& conn, InputBuffer* ibuf) {
                        update_conn_timeout_time(conn);
                        if(ts_msg_cb)
                        {
                            ts_msg_cb(conn, ibuf);
                        }
                    };
    ts_acceptor = make_unique<Acceptor>(this, loop, ip, port);
}